

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSkinMeshBuffer.h
# Opt level: O0

vector3df * __thiscall irr::scene::SSkinMeshBuffer::getPosition(SSkinMeshBuffer *this,u32 i)

{
  int iVar1;
  array<irr::video::S3DVertex> *in_RDI;
  u32 in_stack_ffffffffffffffdc;
  S3DVertexTangents *local_8;
  
  iVar1 = *(int *)&in_RDI[0xc].m_data.
                   super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar1 == 1) {
    local_8 = (S3DVertexTangents *)
              core::array<irr::video::S3DVertex2TCoords>::operator[]
                        ((array<irr::video::S3DVertex2TCoords> *)in_RDI,in_stack_ffffffffffffffdc);
  }
  else if (iVar1 == 2) {
    local_8 = core::array<irr::video::S3DVertexTangents>::operator[]
                        ((array<irr::video::S3DVertexTangents> *)in_RDI,in_stack_ffffffffffffffdc);
  }
  else {
    local_8 = (S3DVertexTangents *)
              core::array<irr::video::S3DVertex>::operator[](in_RDI,in_stack_ffffffffffffffdc);
  }
  return (vector3df *)local_8;
}

Assistant:

const core::vector3df &getPosition(u32 i) const override
	{
		switch (VertexType) {
		case video::EVT_2TCOORDS:
			return Vertices_2TCoords[i].Pos;
		case video::EVT_TANGENTS:
			return Vertices_Tangents[i].Pos;
		default:
			return Vertices_Standard[i].Pos;
		}
	}